

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O2

int wally_script_push_from_bytes
              (uchar *bytes,size_t bytes_len,uint32_t flags,uchar *bytes_out,size_t len,
              size_t *written)

{
  leint16_t data_len;
  int iVar1;
  long lVar2;
  uchar buff [32];
  
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  if (bytes == (uchar *)0x0 && bytes_len != 0) {
    return -2;
  }
  if ((2 < flags || written == (size_t *)0x0) || (len == 0 || bytes_out == (uchar *)0x0)) {
    return -2;
  }
  if ((flags & 1) == 0) {
    if (flags != 0) {
      iVar1 = wally_sha256(bytes,bytes_len,buff,0x20);
      bytes_len = 0x20;
      goto LAB_00108660;
    }
    if (0x4b < bytes_len) {
      lVar2 = 2;
      if (0xff < bytes_len) {
        lVar2 = (ulong)(0xffff < bytes_len) * 2 + 3;
      }
      *written = lVar2 + bytes_len;
      if (len < lVar2 + bytes_len) {
        return 0;
      }
      if (bytes_len < 0x4c) goto LAB_001086d0;
      if (bytes_len < 0x100) {
        *bytes_out = 'L';
        bytes_out[1] = (uchar)bytes_len;
      }
      else if (bytes_len < 0x10000) {
        *bytes_out = 'M';
        *(short *)(bytes_out + 1) = (short)bytes_len;
      }
      else {
        *bytes_out = 'N';
        *(int *)(bytes_out + 1) = (int)bytes_len;
      }
      goto LAB_00108700;
    }
    *written = bytes_len + 1;
    if (len <= bytes_len) {
      return 0;
    }
    lVar2 = 1;
LAB_001086d0:
    *bytes_out = (uchar)bytes_len;
    if (bytes_len != 0) goto LAB_00108700;
  }
  else {
    iVar1 = wally_hash160(bytes,bytes_len,buff,0x14);
    bytes_len = 0x14;
LAB_00108660:
    if (iVar1 != 0) goto LAB_00108710;
    *written = bytes_len | 1;
    if (len <= bytes_len) {
      return 0;
    }
    *bytes_out = (uchar)bytes_len;
    lVar2 = 1;
    bytes = buff;
LAB_00108700:
    memcpy(bytes_out + lVar2,bytes,bytes_len);
  }
  iVar1 = 0;
LAB_00108710:
  wally_clear(buff,0x20);
  return iVar1;
}

Assistant:

int wally_script_push_from_bytes(const unsigned char *bytes, size_t bytes_len,
                                 uint32_t flags,
                                 unsigned char *bytes_out, size_t len,
                                 size_t *written)
{
    unsigned char buff[SHA256_LEN];
    size_t opcode_len;
    int ret = WALLY_OK;

    if (written)
        *written = 0;

    if ((bytes_len && !bytes) || !script_flags_ok(flags, 0) ||
        !bytes_out || !len || !written)
        return WALLY_EINVAL;

    if (flags & WALLY_SCRIPT_HASH160) {
        ret = wally_hash160(bytes, bytes_len, buff, HASH160_LEN);
        bytes = buff;
        bytes_len = HASH160_LEN;
    } else if (flags & WALLY_SCRIPT_SHA256) {
        ret = wally_sha256(bytes, bytes_len, buff, SHA256_LEN);
        bytes = buff;
        bytes_len = SHA256_LEN;
    }
    if (ret != WALLY_OK)
        goto cleanup;

    opcode_len = calc_push_opcode_size(bytes_len);

    *written = bytes_len + opcode_len;
    if (len < *written)
        return WALLY_OK; /* Caller needs to pass a bigger buffer */

    if (bytes_len < 76)
        bytes_out[0] = bytes_len;
    else if (bytes_len < 256) {
        bytes_out[0] = OP_PUSHDATA1;
        bytes_out[1] = bytes_len;
    } else if (bytes_len < 65536) {
        leint16_t data_len = cpu_to_le16(bytes_len);
        bytes_out[0] = OP_PUSHDATA2;
        memcpy(bytes_out + 1, &data_len, sizeof(data_len));
    } else {
        leint32_t data_len = cpu_to_le32(bytes_len);
        bytes_out[0] = OP_PUSHDATA4;
        memcpy(bytes_out + 1, &data_len, sizeof(data_len));
    }
    if (bytes_len)
        memcpy(bytes_out + opcode_len, bytes, bytes_len);

cleanup:
    wally_clear(buff, sizeof(buff));
    return ret;
}